

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

bool __thiscall
Clasp::Cli::ClaspAppBase::handlePostGroundOptions(ClaspAppBase *this,ProgramBuilder *prg)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ProgramReader *pPVar4;
  LemmaLogger *pLVar5;
  AspParser *__n;
  AspParser *in_RSI;
  Application *in_RDI;
  logic_error *e;
  ofstream null;
  Format outf;
  LogicProgram *asp;
  undefined4 in_stack_fffffffffffffd60;
  ReadMode in_stack_fffffffffffffd64;
  ProgramReader *in_stack_fffffffffffffd68;
  LogicProgram *in_stack_fffffffffffffd78;
  undefined1 *this_00;
  undefined1 local_228 [15];
  undefined1 in_stack_fffffffffffffde7;
  ProgramBuilder *in_stack_fffffffffffffde8;
  LemmaLogger *in_stack_fffffffffffffdf0;
  bool local_1;
  
  if (*(char *)((long)&in_RDI[0xd].exitCode_ + 1) == '\0') {
    pPVar4 = SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject> *)0x118f72);
    if (pPVar4 != (ProgramReader *)0x0) {
      SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject>::operator->
                ((SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject> *)0x118f89);
      Potassco::ProgramReader::parse(in_stack_fffffffffffffd68,in_stack_fffffffffffffd64);
    }
    pLVar5 = SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject> *)0x118fa4);
    if (pLVar5 != (LemmaLogger *)0x0) {
      SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject>::operator->
                ((SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject> *)0x118fbb);
      SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject>::operator->
                ((SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject> *)0x118fde);
      ClaspFacade::incremental((ClaspFacade *)0x118fe6);
      LemmaLogger::startStep
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(bool)in_stack_fffffffffffffde7
                );
    }
    local_1 = true;
  }
  else {
    ProgramBuilder::endProgram
              ((ProgramBuilder *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    iVar2 = ProgramBuilder::type((ProgramBuilder *)0x119022);
    if (iVar2 == 2) {
      uVar3 = (uint)*(char *)((long)&in_RDI[0xd].exitCode_ + 1);
      __n = in_RSI;
      if ((uVar3 == 0xffffffff) &&
         (bVar1 = Asp::LogicProgram::supportsSmodels(in_stack_fffffffffffffd78), !bVar1)) {
        this_00 = local_228;
        std::ofstream::ofstream(this_00);
        AspParser::write(in_RSI,(int)this_00,(void *)0xffffffff,(size_t)__n);
        std::ofstream::~ofstream(local_228);
      }
      AspParser::write(in_RSI,0x2e3408,(void *)(ulong)uVar3,(size_t)__n);
    }
    else {
      (*in_RDI->_vptr_Application[6])(in_RDI,"Option \'--pre\': unsupported input format!");
      Potassco::Application::setExitCode(in_RDI,0x41);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ClaspAppBase::handlePostGroundOptions(ProgramBuilder& prg) {
	if (!claspAppOpts_.onlyPre) {
		if (lemmaIn_.get()) { lemmaIn_->parse(); }
		if (logger_.get())  { logger_->startStep(prg, clasp_->incremental()); }
		return true;
	}
	prg.endProgram();
	if (prg.type() == Problem_t::Asp) {
		Asp::LogicProgram& asp = static_cast<Asp::LogicProgram&>(prg);
		AspParser::Format outf = static_cast<AspParser::Format>(claspAppOpts_.onlyPre);
		if (outf == AspParser::format_smodels && !asp.supportsSmodels()) {
			std::ofstream null;
			try { AspParser::write(asp, null, outf); }
			catch (const std::logic_error& e) {
				error("Option '--pre': unsupported input format!");
				info(std::string(e.what()).append(" in 'smodels' format").c_str());
				info("Try '--pre=aspif' to print in 'aspif' format");
				setExitCode(E_ERROR);
				return false;
			}
		}
		AspParser::write(asp, std::cout, outf);
	}
	else {
		error("Option '--pre': unsupported input format!");
		setExitCode(E_ERROR);
	}
	return false;
}